

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O0

int Io_WritePlaOne(FILE *pFile,Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint nItemsTotal;
  int iVar3;
  Abc_Obj_t *pAVar4;
  void *__s;
  void *__s_00;
  char *pcVar5;
  ProgressBar *p;
  Abc_Obj_t *pAVar6;
  int nFanins;
  int nOutputs;
  int nInputs;
  int nProducts;
  int k;
  int i;
  char *pCube;
  char *pCubeOut;
  char *pCubeIn;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  ProgressBar *pProgress;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  nOutputs = 0;
  for (nProducts = 0; iVar1 = Abc_NtkCoNum(pNtk), nProducts < iVar1; nProducts = nProducts + 1) {
    pAVar4 = Abc_NtkCo(pNtk,nProducts);
    pAVar4 = Abc_ObjFanin0(pAVar4);
    pAVar4 = Abc_ObjFanin0Ntk(pAVar4);
    iVar1 = Abc_ObjIsNode(pAVar4);
    if (iVar1 == 0) {
      nOutputs = nOutputs + 1;
    }
    else {
      iVar1 = Abc_NodeIsConst(pAVar4);
      if (iVar1 == 0) {
        iVar1 = Abc_SopGetCubeNum((char *)(pAVar4->field_5).pData);
        nOutputs = iVar1 + nOutputs;
      }
      else {
        iVar1 = Abc_NodeIsConst1(pAVar4);
        if (iVar1 != 0) {
          nOutputs = nOutputs + 1;
        }
      }
    }
  }
  uVar2 = Abc_NtkCiNum(pNtk);
  nItemsTotal = Abc_NtkCoNum(pNtk);
  __s = malloc((long)(int)(uVar2 + 1));
  __s_00 = malloc((long)(int)(nItemsTotal + 1));
  memset(__s,0x2d,(long)(int)uVar2);
  *(undefined1 *)((long)__s + (long)(int)uVar2) = 0;
  memset(__s_00,0x30,(long)(int)nItemsTotal);
  *(undefined1 *)((long)__s_00 + (long)(int)nItemsTotal) = 0;
  fprintf((FILE *)pFile,".i %d\n",(ulong)uVar2);
  fprintf((FILE *)pFile,".o %d\n",(ulong)nItemsTotal);
  fprintf((FILE *)pFile,".ilb");
  for (nProducts = 0; iVar1 = Abc_NtkCiNum(pNtk), nProducts < iVar1; nProducts = nProducts + 1) {
    pAVar4 = Abc_NtkCi(pNtk,nProducts);
    pAVar4 = Abc_ObjFanout0(pAVar4);
    pcVar5 = Abc_ObjName(pAVar4);
    fprintf((FILE *)pFile," %s",pcVar5);
  }
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,".ob");
  for (nProducts = 0; iVar1 = Abc_NtkCoNum(pNtk), nProducts < iVar1; nProducts = nProducts + 1) {
    pAVar4 = Abc_NtkCo(pNtk,nProducts);
    pAVar4 = Abc_ObjFanin0(pAVar4);
    pcVar5 = Abc_ObjName(pAVar4);
    fprintf((FILE *)pFile," %s",pcVar5);
  }
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,".p %d\n",(ulong)(uint)nOutputs);
  for (nProducts = 0; iVar1 = Abc_NtkCiNum(pNtk), nProducts < iVar1; nProducts = nProducts + 1) {
    pAVar4 = Abc_NtkCi(pNtk,nProducts);
    pAVar4->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)nProducts;
  }
  p = Extra_ProgressBarStart(_stdout,nItemsTotal);
  nProducts = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= nProducts) {
      Extra_ProgressBarStop(p);
      fprintf((FILE *)pFile,".e\n");
      for (nProducts = 0; iVar1 = Abc_NtkCiNum(pNtk), nProducts < iVar1; nProducts = nProducts + 1)
      {
        pAVar4 = Abc_NtkCi(pNtk,nProducts);
        (pAVar4->field_6).pTemp = (void *)0x0;
      }
      if (__s != (void *)0x0) {
        free(__s);
      }
      if (__s_00 != (void *)0x0) {
        free(__s_00);
      }
      return 1;
    }
    pAVar4 = Abc_NtkCo(pNtk,nProducts);
    if (-1 < nProducts + -1) {
      *(undefined1 *)((long)__s_00 + (long)(nProducts + -1)) = 0x30;
    }
    *(undefined1 *)((long)__s_00 + (long)nProducts) = 0x31;
    pAVar6 = Abc_ObjFanin0(pAVar4);
    pAVar6 = Abc_ObjFanin0Ntk(pAVar6);
    iVar1 = Abc_ObjIsNode(pAVar6);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsCi(pAVar6);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsCi(pDriver)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                      ,0x70,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
      }
      iVar1 = Abc_ObjFaninC0(pAVar4);
      *(char *)((long)__s + (long)(pAVar6->field_6).iTemp) = '1' - (char)iVar1;
      fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
      *(undefined1 *)((long)__s + (long)(pAVar6->field_6).iTemp) = 0x2d;
    }
    else {
      iVar1 = Abc_NodeIsConst(pAVar6);
      if (iVar1 == 0) {
        iVar1 = Abc_SopIsComplement((char *)(pAVar6->field_5).pData);
        if (iVar1 != 0) {
          __assert_fail("!Abc_SopIsComplement( (char *)pDriver->pData )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                        ,0x7e,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
        }
        iVar1 = Abc_ObjFaninNum(pAVar6);
        for (_k = (char *)(pAVar6->field_5).pData; *_k != '\0'; _k = _k + (iVar1 + 3)) {
          for (nInputs = 0; iVar3 = Abc_ObjFaninNum(pAVar6), nInputs < iVar3; nInputs = nInputs + 1)
          {
            pAVar4 = Abc_ObjFanin(pAVar6,nInputs);
            pAVar4 = Abc_ObjFanin0Ntk(pAVar4);
            if ((int)uVar2 <= (pAVar4->field_6).iTemp) {
              __assert_fail("(int)(ABC_PTRUINT_T)pFanin->pCopy < nInputs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                            ,0x87,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
            }
            *(char *)((long)__s + (long)(pAVar4->field_6).iTemp) = _k[nInputs];
          }
          fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
        }
        for (nInputs = 0; iVar1 = Abc_ObjFaninNum(pAVar6), nInputs < iVar1; nInputs = nInputs + 1) {
          pAVar4 = Abc_ObjFanin(pAVar6,nInputs);
          pAVar4 = Abc_ObjFanin0Ntk(pAVar4);
          iVar1 = Abc_ObjIsCi(pAVar4);
          if (iVar1 == 0) {
            __assert_fail("Abc_ObjIsCi(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                          ,0x90,"int Io_WritePlaOne(FILE *, Abc_Ntk_t *)");
          }
          *(undefined1 *)((long)__s + (long)(pAVar4->field_6).iTemp) = 0x2d;
        }
        Extra_ProgressBarUpdate(p,nProducts,(char *)0x0);
      }
      else {
        iVar1 = Abc_NodeIsConst1(pAVar6);
        if (iVar1 != 0) {
          fprintf((FILE *)pFile,"%s %s\n",__s,__s_00);
        }
      }
    }
    nProducts = nProducts + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the network in PLA format.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Io_WritePlaOne( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNode, * pFanin, * pDriver;
    char * pCubeIn, * pCubeOut, * pCube;
    int i, k, nProducts, nInputs, nOutputs, nFanins;

    nProducts = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            nProducts++;
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                nProducts++;
            continue;
        }
        nProducts += Abc_SopGetCubeNum((char *)pDriver->pData);
    }

    // collect the parameters
    nInputs  = Abc_NtkCiNum(pNtk);
    nOutputs = Abc_NtkCoNum(pNtk);
    pCubeIn  = ABC_ALLOC( char, nInputs + 1 );
    pCubeOut = ABC_ALLOC( char, nOutputs + 1 );
    memset( pCubeIn,  '-', nInputs );     pCubeIn[nInputs]   = 0;
    memset( pCubeOut, '0', nOutputs );    pCubeOut[nOutputs] = 0;

    // write the header
    fprintf( pFile, ".i %d\n", nInputs );
    fprintf( pFile, ".o %d\n", nOutputs );
    fprintf( pFile, ".ilb" );
    Abc_NtkForEachCi( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanout0(pNode)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".ob" );
    Abc_NtkForEachCo( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin0(pNode)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".p %d\n", nProducts );

    // mark the CI nodes
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;

    // write the cubes
    pProgress = Extra_ProgressBarStart( stdout, nOutputs );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // prepare the output cube
        if ( i - 1 >= 0 )
            pCubeOut[i-1] = '0';
        pCubeOut[i] = '1';

        // consider special cases of nodes
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            assert( Abc_ObjIsCi(pDriver) );
            pCubeIn[(int)(ABC_PTRUINT_T)pDriver->pCopy] = '1' - Abc_ObjFaninC0(pNode);
            fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
            pCubeIn[(int)(ABC_PTRUINT_T)pDriver->pCopy] = '-';
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
            continue;
        }

        // make sure the cover is not complemented
        assert( !Abc_SopIsComplement( (char *)pDriver->pData ) );

        // write the cubes
        nFanins = Abc_ObjFaninNum(pDriver);
        Abc_SopForEachCube( (char *)pDriver->pData, nFanins, pCube )
        {
            Abc_ObjForEachFanin( pDriver, pFanin, k )
            {
                pFanin = Abc_ObjFanin0Ntk(pFanin);
                assert( (int)(ABC_PTRUINT_T)pFanin->pCopy < nInputs );
                pCubeIn[(int)(ABC_PTRUINT_T)pFanin->pCopy] = pCube[k];
            }
            fprintf( pFile, "%s %s\n", pCubeIn, pCubeOut );
        }
        // clean the cube for future writing
        Abc_ObjForEachFanin( pDriver, pFanin, k )
        {
            pFanin = Abc_ObjFanin0Ntk(pFanin);
            assert( Abc_ObjIsCi(pFanin) );
            pCubeIn[(int)(ABC_PTRUINT_T)pFanin->pCopy] = '-';
        }
        Extra_ProgressBarUpdate( pProgress, i, NULL );
    }
    Extra_ProgressBarStop( pProgress );
    fprintf( pFile, ".e\n" );

    // clean the CI nodes
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = NULL;
    ABC_FREE( pCubeIn );
    ABC_FREE( pCubeOut );
    return 1;
}